

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void calc_sad4_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int cand_start,int *cost_list)

{
  undefined4 in_ECX;
  long in_RDI;
  long in_R8;
  int found_better_mv;
  FULLPEL_MV this_mv;
  int j_1;
  int j;
  int src_stride;
  uint8_t *src_buf;
  uint *sads;
  uint sads_buf [4];
  uchar *block_offset [4];
  search_site *site;
  buf_2d *ref;
  buf_2d *src;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  FULLPEL_MV *mv;
  uint *puVar4;
  uint local_78 [2];
  FULLPEL_MV *in_stack_ffffffffffffff90;
  long local_68 [4];
  long local_48;
  long local_40;
  undefined8 *local_38;
  long local_28;
  long local_10;
  undefined4 local_4;
  
  local_38 = *(undefined8 **)(in_RDI + 0x18);
  local_40 = *(long *)(in_RDI + 0x10);
  local_48 = *(long *)(in_RDI + 0x50) + (long)(int)this_mv * 0x88;
  mv = (FULLPEL_MV *)*local_38;
  uVar3 = *(undefined4 *)(local_38 + 3);
  if (sads == (uint *)0x0) {
    puVar4 = local_78;
  }
  else {
    puVar4 = sads + 1;
  }
  local_28 = in_R8;
  local_10 = in_RDI;
  local_4 = in_ECX;
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    local_68[iVar2] = local_28 + *(int *)(local_48 + 4 + (long)((int)src_buf + iVar2) * 8);
  }
  (**(code **)(local_10 + 0xd0))(mv,uVar3,local_68,*(undefined4 *)(local_40 + 0x18),puVar4);
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    in_stack_ffffffffffffff64 =
         update_mvs_and_sad((uint)puVar4,mv,(MV_COST_PARAMS *)CONCAT44(uVar3,iVar2),
                            (uint *)CONCAT44(iVar1,CONCAT22(local_4._2_2_ +
                                                            *(short *)(local_48 + 2 +
                                                                      (long)((int)src_buf + iVar1) *
                                                                      8),
                                                            (short)local_4 +
                                                            *(short *)(local_48 +
                                                                      (long)((int)src_buf + iVar1) *
                                                                      8))),
                            (uint *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                            (FULLPEL_MV *)0x0,in_stack_ffffffffffffff90);
    if (in_stack_ffffffffffffff64 != 0) {
      *_j = (int)src_buf + iVar1;
    }
  }
  return;
}

Assistant:

static inline void calc_sad4_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, int cand_start, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];

  unsigned char const *block_offset[4];
  unsigned int sads_buf[4];
  unsigned int *sads;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  if (cost_list) {
    sads = (unsigned int *)(cost_list + 1);
  } else {
    sads = sads_buf;
  }
  // Loop over number of candidates.
  for (int j = 0; j < 4; j++)
    block_offset[j] = site[cand_start + j].offset + center_address;

  // 4-point sad calculation.
  ms_params->sdx4df(src_buf, src_stride, block_offset, ref->stride, sads);

  for (int j = 0; j < 4; j++) {
    const FULLPEL_MV this_mv = { center_mv.row + site[cand_start + j].mv.row,
                                 center_mv.col + site[cand_start + j].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = cand_start + j;
  }
}